

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

bool __thiscall
HighsSymmetryDetection::compareCurrentGraph
          (HighsSymmetryDetection *this,
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *otherGraph,HighsInt *wrongCell)

{
  HighsInt HVar1;
  pointer ppVar2;
  bool bVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  u8 local_5d;
  KeyType local_5c;
  HighsInt *local_50;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  if (0 < this->numCol) {
    piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    local_50 = wrongCell;
    do {
      HVar1 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      iVar5 = piVar4[lVar7];
      if (iVar5 != (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7]) {
        lVar6 = (long)iVar5;
        do {
          ppVar2 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
               (_Head_base<2UL,_unsigned_int,_false>)ppVar2[lVar6].second;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar2[lVar6].first];
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               HVar1;
          bVar3 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                            (otherGraph,&local_5c,&local_5d,&local_40,&local_48,&local_38);
          if ((!bVar3) ||
             ((otherGraph->entries)._M_t.
              super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              ._M_t.
              super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              .
              super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
              ._M_head_impl == (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0)
             ) goto LAB_002fb150;
          lVar6 = lVar6 + 1;
          iVar5 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
        } while ((int)lVar6 != iVar5);
        piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (iVar5 != piVar4[lVar7 + 1]) {
        lVar6 = (long)iVar5;
        do {
          ppVar2 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
               (_Head_base<2UL,_unsigned_int,_false>)ppVar2[lVar6].second;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = ppVar2[lVar6].first;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               HVar1;
          bVar3 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                            (otherGraph,&local_5c,&local_5d,&local_40,&local_48,&local_38);
          if ((!bVar3) ||
             ((otherGraph->entries)._M_t.
              super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              ._M_t.
              super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              .
              super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
              ._M_head_impl == (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0)
             ) {
LAB_002fb150:
            *local_50 = HVar1;
            return false;
          }
          lVar6 = lVar6 + 1;
          piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while ((int)lVar6 != piVar4[lVar7 + 1]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->numCol);
  }
  return true;
}

Assistant:

bool HighsSymmetryDetection::compareCurrentGraph(
    const HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>& otherGraph,
    HighsInt& wrongCell) {
  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];

    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      if (!otherGraph.find(std::make_tuple(vertexToCell[Gedge[j].first],
                                           colCell, Gedge[j].second))) {
        // return which cell does not match in its neighbourhood as this should
        // have been detected with the hashing it can very rarely happen due to
        // a hash collision. In such a case we want to backtrack to the last
        // time where we targeted this particular cell. Otherwise we could spent
        // a long time searching for a matching leave value until every
        // combination is exhausted and for each leave in this subtree the graph
        // comparison will fail on this edge.
        wrongCell = colCell;
        return false;
      }
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      if (!otherGraph.find(
              std::make_tuple(Gedge[j].first, colCell, Gedge[j].second))) {
        wrongCell = colCell;
        return false;
      }
  }

  return true;
}